

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.hpp
# Opt level: O2

void __thiscall duckdb::AggregateHTScanState::AggregateHTScanState(AggregateHTScanState *this)

{
  this->partition_idx = 0;
  TupleDataScanState::TupleDataScanState(&this->scan_states);
  return;
}

Assistant:

AggregateHTScanState() {
	}